

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O2

bool __thiscall
helics::apps::AppTextParser::loadNextLine(AppTextParser *this,string *line,int *lineNumber)

{
  uint uVar1;
  pointer pcVar2;
  bool bVar3;
  istream *piVar4;
  size_type sVar5;
  
LAB_0023853b:
  do {
    do {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&this->filePtr,(string *)line);
      uVar1 = *(uint *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18) + 0x20);
      if ((uVar1 & 5) != 0) {
LAB_002385f3:
        return (uVar1 & 5) == 0;
      }
      this->currentLineNumber = this->currentLineNumber + 1;
    } while (line->_M_string_length == 0);
    sVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_not_of(line," \t\n\r",0);
  } while (sVar5 == 0xffffffffffffffff);
  if (this->mLineComment == true) {
    if (((line->_M_string_length <= sVar5 + 2) ||
        (pcVar2 = (line->_M_dataplus)._M_p, pcVar2[sVar5] != '#')) ||
       ((pcVar2[sVar5 + 1] != '#' || (pcVar2[sVar5 + 2] != ']')))) goto LAB_0023853b;
    bVar3 = false;
  }
  else {
    pcVar2 = (line->_M_dataplus)._M_p;
    if (pcVar2[sVar5] == '!') goto LAB_0023853b;
    if (pcVar2[sVar5] != '#') {
      *lineNumber = this->currentLineNumber;
      goto LAB_002385f3;
    }
    if (((line->_M_string_length <= sVar5 + 2) || (pcVar2[sVar5 + 1] != '#')) ||
       (bVar3 = true, pcVar2[sVar5 + 2] != '[')) goto LAB_0023853b;
  }
  this->mLineComment = bVar3;
  goto LAB_0023853b;
}

Assistant:

bool AppTextParser::loadNextLine(std::string& line, int& lineNumber)
{
    while (std::getline(filePtr, line)) {
        ++currentLineNumber;
        if (line.empty()) {
            continue;
        }
        auto firstChar = line.find_first_not_of(" \t\n\r\0");
        if (firstChar == std::string::npos) {
            continue;
        }
        if (mLineComment) {
            if (firstChar + 2 < line.size()) {
                if ((line[firstChar] == '#') && (line[firstChar + 1] == '#') &&
                    (line[firstChar + 2] == ']')) {
                    mLineComment = false;
                }
            }
            continue;
        }
        if (line[firstChar] == '#') {
            if (firstChar + 2 < line.size()) {
                if ((line[firstChar + 1] == '#') && (line[firstChar + 2] == '[')) {
                    mLineComment = true;
                }
            }
            continue;
        }
        if (line[firstChar] == '!') {
            continue;
        }
        lineNumber = currentLineNumber;
        return true;
    }
    return false;
}